

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O0

void __thiscall
cmGlobalGenerator::SetLanguageEnabledFlag(cmGlobalGenerator *this,string *l,cmMakefile *mf)

{
  cmState *this_00;
  cmMakefile *mf_local;
  string *l_local;
  cmGlobalGenerator *this_local;
  
  this_00 = cmake::GetState(this->CMakeInstance);
  cmState::SetLanguageEnabled(this_00,l);
  FillExtensionToLanguageMap(this,l,mf);
  return;
}

Assistant:

void cmGlobalGenerator::SetLanguageEnabledFlag(const std::string& l,
                                               cmMakefile* mf)
{
  this->CMakeInstance->GetState()->SetLanguageEnabled(l);

  // Fill the language-to-extension map with the current variable
  // settings to make sure it is available for the try_compile()
  // command source file signature.  In SetLanguageEnabledMaps this
  // will be done again to account for any compiler- or
  // platform-specific entries.
  this->FillExtensionToLanguageMap(l, mf);
}